

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c1a11d::LevelTest_TestTargetLevelRecode_Test::TestBody
          (LevelTest_TestTargetLevelRecode_Test *this)

{
  bool bVar1;
  long in_RDI;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int target_level;
  I420VideoSource video;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff14;
  allocator *message;
  int line;
  uint in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  Type in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  uint in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  allocator local_89;
  string local_88 [16];
  Message *in_stack_ffffffffffffff88;
  AssertHelper *in_stack_ffffffffffffff90;
  undefined1 local_68 [104];
  
  if (*(int *)(in_RDI + 0x3f8) != 4) {
    return;
  }
  if (*(int *)(in_RDI + 0x3f4) != 2) {
    return;
  }
  message = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"rand_noise_w1280h720.yuv",message);
  uVar2 = 10;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,(int)((ulong)in_RDI >> 0x20),
             (int)in_RDI,in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  *(undefined4 *)(in_RDI + 0x3fc) = 5;
  *(undefined4 *)(in_RDI + 0xb8) = 5000;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(in_RDI + 0x18,local_68);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)&stack0xffffffffffffff48);
    if (bVar1) {
      in_stack_ffffffffffffff44 = 2;
    }
    else {
      in_stack_ffffffffffffff44 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_ffffffffffffff14,uVar2));
    if ((in_stack_ffffffffffffff44 == 0) || (in_stack_ffffffffffffff44 != 2)) goto LAB_008b21f2;
  }
  line = (int)((ulong)in_RDI >> 0x20);
  testing::Message::Message
            ((Message *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff3c,
             (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),line,
             (char *)message);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff14,uVar2));
  testing::Message::~Message((Message *)0x8b21ac);
LAB_008b21f2:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x8b21ff);
  return;
}

Assistant:

TEST_P(LevelTest, TestTargetLevelRecode) {
  if (cpu_used_ == 4 && encoding_mode_ == ::libaom_test::kTwoPassGood) {
    libaom_test::I420VideoSource video("rand_noise_w1280h720.yuv", 1280, 720,
                                       25, 1, 0, 10);
    const int target_level = 0005;
    target_level_ = target_level;
    cfg_.rc_target_bitrate = 5000;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  }
}